

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ab,sunrealtype droptol,int sparsetype)

{
  long *plVar1;
  long M;
  long N;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  SUNMatrix p_Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  sunindextype NNZ;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  plVar1 = (long *)Ab->content;
  M = *plVar1;
  N = plVar1[1];
  if (N < 1) {
    NNZ = 0;
  }
  else {
    lVar10 = -plVar1[3];
    lVar12 = 0;
    lVar13 = 0;
    NNZ = 0;
    do {
      lVar14 = 0;
      if (0 < lVar10) {
        lVar14 = lVar10;
      }
      lVar9 = lVar13 - plVar1[3];
      if (lVar9 < 1) {
        lVar9 = 0;
      }
      lVar15 = plVar1[4] + lVar13;
      if (M <= plVar1[4] + lVar13) {
        lVar15 = M + -1;
      }
      if (lVar9 <= lVar15) {
        lVar14 = lVar14 + -1;
        do {
          NNZ = NNZ + (ulong)(droptol <
                             ABS(*(double *)
                                  (lVar12 + plVar1[5] * 8 + *(long *)(plVar1[8] + lVar13 * 8) + 8 +
                                  lVar14 * 8)));
          lVar14 = lVar14 + 1;
        } while (lVar14 < lVar15);
      }
      lVar13 = lVar13 + 1;
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + -8;
    } while (lVar13 != N);
  }
  p_Var5 = SUNSparseMatrix(M,N,NNZ,sparsetype,Ab->sunctx);
  if (sparsetype == 0) {
    pvVar2 = p_Var5->content;
    lVar10 = *(long *)((long)pvVar2 + 0x38);
    if (N < 1) {
      lVar12 = 0;
    }
    else {
      pvVar3 = Ab->content;
      lVar13 = 0;
      lVar14 = 0;
      lVar12 = 0;
      do {
        *(long *)(lVar10 + lVar14 * 8) = lVar12;
        lVar9 = lVar14 - *(long *)((long)pvVar3 + 0x18);
        if (lVar9 < 1) {
          lVar9 = 0;
        }
        lVar15 = *(long *)((long)pvVar3 + 0x20);
        lVar6 = lVar15 + lVar14;
        if (M <= lVar15 + lVar14) {
          lVar6 = M + -1;
        }
        if (lVar9 <= lVar6) {
          lVar6 = *(long *)((long)pvVar3 + 0x28);
          lVar8 = *(long *)(*(long *)((long)pvVar3 + 0x40) + lVar14 * 8) + lVar13;
          do {
            if (droptol < ABS(*(double *)(lVar8 + lVar6 * 8 + lVar9 * 8))) {
              *(long *)(*(long *)((long)pvVar2 + 0x30) + lVar12 * 8) = lVar9;
              lVar6 = *(long *)((long)pvVar3 + 0x28);
              *(undefined8 *)(*(long *)((long)pvVar2 + 0x20) + lVar12 * 8) =
                   *(undefined8 *)(lVar8 + lVar6 * 8 + lVar9 * 8);
              lVar12 = lVar12 + 1;
              lVar15 = *(long *)((long)pvVar3 + 0x20);
            }
            lVar11 = lVar15 + lVar14;
            if (M <= lVar15 + lVar14) {
              lVar11 = M + -1;
            }
            bVar4 = lVar9 < lVar11;
            lVar9 = lVar9 + 1;
          } while (bVar4);
        }
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + -8;
      } while (lVar14 != N);
    }
    *(long *)(lVar10 + N * 8) = lVar12;
  }
  else {
    pvVar2 = p_Var5->content;
    lVar10 = *(long *)((long)pvVar2 + 0x38);
    if (M < 1) {
      lVar12 = 0;
    }
    else {
      pvVar3 = Ab->content;
      lVar13 = 0;
      lVar14 = 0;
      lVar12 = 0;
      do {
        *(long *)(lVar10 + lVar14 * 8) = lVar12;
        lVar9 = *(long *)((long)pvVar3 + 0x18);
        lVar6 = lVar14 - *(long *)((long)pvVar3 + 0x20);
        lVar15 = 0;
        if (0 < lVar6) {
          lVar15 = lVar6;
        }
        lVar8 = lVar9 + lVar14;
        if (N <= lVar9 + lVar14) {
          lVar8 = N + -1;
        }
        if (lVar15 <= lVar8) {
          lVar8 = *(long *)((long)pvVar3 + 0x28);
          if (lVar6 < 1) {
            lVar6 = 0;
          }
          lVar11 = *(long *)((long)pvVar3 + 0x40);
          lVar6 = lVar13 + lVar6 * -8;
          do {
            lVar7 = *(long *)(lVar11 + lVar15 * 8);
            if (droptol < ABS(*(double *)(lVar6 + lVar7 + lVar8 * 8))) {
              *(long *)(*(long *)((long)pvVar2 + 0x30) + lVar12 * 8) = lVar15;
              lVar8 = *(long *)((long)pvVar3 + 0x28);
              *(undefined8 *)(*(long *)((long)pvVar2 + 0x20) + lVar12 * 8) =
                   *(undefined8 *)(lVar6 + lVar7 + lVar8 * 8);
              lVar12 = lVar12 + 1;
              lVar9 = *(long *)((long)pvVar3 + 0x18);
            }
            lVar7 = lVar9 + lVar14;
            if (N <= lVar9 + lVar14) {
              lVar7 = N + -1;
            }
            lVar6 = lVar6 + -8;
            bVar4 = lVar15 < lVar7;
            lVar15 = lVar15 + 1;
          } while (bVar4);
        }
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + 8;
      } while (lVar14 != M);
    }
    *(long *)(lVar10 + M * 8) = lVar12;
  }
  return p_Var5;
}

Assistant:

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ab, sunrealtype droptol,
                                  int sparsetype)
{
  SUNFunctionBegin(Ab->sunctx);
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  SUNAssertNull(SUNMatGetID(Ab) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssertNull(sparsetype == CSC_MAT || sparsetype == CSR_MAT,
                SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(droptol >= ZERO, SUN_ERR_ARG_OUTOFRANGE);

  /* set size of new matrix */
  M = SM_ROWS_B(Ab);
  N = SM_COLUMNS_B(Ab);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j = 0; j < N; j++)
  {
    for (i = SUNMAX(0, j - SM_UBAND_B(Ab));
         i <= SUNMIN(M - 1, j + SM_LBAND_B(Ab)); i++)
    {
      nnz += (SUNRabs(SM_ELEMENT_B(Ab, i, j)) > droptol);
    }
  }

  /* allocate sparse matrix */
  As = SUNSparseMatrix(M, N, nnz, sparsetype, Ab->sunctx);
  SUNCheckLastErrNull();

  /* copy nonzeros from Ab into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT)
  {
    for (j = 0; j < N; j++)
    {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i = SUNMAX(0, j - SM_UBAND_B(Ab));
           i <= SUNMIN(M - 1, j + SM_LBAND_B(Ab)); i++)
      {
        if (SUNRabs(SM_ELEMENT_B(Ab, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_B(Ab, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  }
  else
  { /* CSR_MAT */
    for (i = 0; i < M; i++)
    {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j = SUNMAX(0, i - SM_LBAND_B(Ab));
           j <= SUNMIN(N - 1, i + SM_UBAND_B(Ab)); j++)
      {
        if (SUNRabs(SM_ELEMENT_B(Ab, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_B(Ab, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }

  return (As);
}